

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

iterator __thiscall llvm::yaml::Scanner::skip_nb_char(Scanner *this,iterator Position)

{
  UTF8Decoded UVar1;
  uint local_28;
  uint uStack_24;
  UTF8Decoded u8d;
  iterator Position_local;
  Scanner *this_local;
  
  this_local = (Scanner *)Position;
  if (Position != this->End) {
    if ((*Position == '\t') || (('\x1f' < *Position && (*Position < '\x7f')))) {
      this_local = (Scanner *)(Position + 1);
    }
    else if ((*Position & 0x80U) != 0) {
      UVar1 = decodeUTF8(this,Position);
      uStack_24 = UVar1.second;
      if (((uStack_24 != 0) && (local_28 = UVar1.first, local_28 != 0xfeff)) &&
         ((((local_28 == 0x85 || ((0x9f < local_28 && (local_28 < 0xd800)))) ||
           ((0xdfff < local_28 && (local_28 < 0xfffe)))) ||
          ((0xffff < local_28 && (local_28 < 0x110000)))))) {
        this_local = (Scanner *)(Position + uStack_24);
      }
    }
  }
  return (iterator)this_local;
}

Assistant:

StringRef::iterator Scanner::skip_nb_char(StringRef::iterator Position) {
  if (Position == End)
    return Position;
  // Check 7 bit c-printable - b-char.
  if (   *Position == 0x09
      || (*Position >= 0x20 && *Position <= 0x7E))
    return Position + 1;

  // Check for valid UTF-8.
  if (uint8_t(*Position) & 0x80) {
    UTF8Decoded u8d = decodeUTF8(Position);
    if (   u8d.second != 0
        && u8d.first != 0xFEFF
        && ( u8d.first == 0x85
          || ( u8d.first >= 0xA0
            && u8d.first <= 0xD7FF)
          || ( u8d.first >= 0xE000
            && u8d.first <= 0xFFFD)
          || ( u8d.first >= 0x10000
            && u8d.first <= 0x10FFFF)))
      return Position + u8d.second;
  }
  return Position;
}